

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O2

pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *
__thiscall
CppMLNN::preprocess_data
          (pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           *__return_storage_ptr__,CppMLNN *this,MatrixXd *examples,VectorXd *labels)

{
  ostream *poVar1;
  MatrixXd examples_norm;
  MatrixXd labels_mat;
  MatrixXd local_50;
  MatrixXd local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"preprocess_data");
  std::endl<char,std::char_traits<char>>(poVar1);
  build_labels_matrix(&local_38,this,labels);
  normalize_examples(&local_50,this,examples);
  std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
  pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_true>
            (__return_storage_ptr__,&local_50,&local_38);
  free(local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

pair<MatrixXd, MatrixXd> CppMLNN::preprocess_data(const MatrixXd& examples, const VectorXd& labels) {
	cout << __FUNCTION__ << endl;

	MatrixXd labels_mat = build_labels_matrix(labels);
	MatrixXd examples_norm = normalize_examples(examples);

	return make_pair(examples_norm, labels_mat);
}